

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O1

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
::WriteString(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator,_0U>
              *this,Ch *str,SizeType length)

{
  char *pcVar1;
  byte *pbVar2;
  Ch *pCVar3;
  byte bVar4;
  char cVar5;
  Ch CVar6;
  Stack<rapidjson::CrtAllocator> *this_00;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *pGVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  Ch *pCVar11;
  ulong uVar12;
  bool bVar13;
  
  this_00 = &this->os_->stack_;
  uVar12 = (ulong)(length * 6 + 2);
  if (this_00->stackEnd_ < this_00->stackTop_ + uVar12) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(this_00,uVar12);
  }
  pGVar7 = this->os_;
  pcVar8 = (pGVar7->stack_).stackTop_;
  pcVar1 = pcVar8 + 1;
  if (pcVar1 <= (pGVar7->stack_).stackEnd_) {
    (pGVar7->stack_).stackTop_ = pcVar1;
    *pcVar8 = '\"';
    bVar13 = length == 0;
    if (!bVar13) {
      uVar12 = 0;
      do {
        bVar4 = str[uVar12];
        cVar5 = "uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar4];
        pGVar7 = this->os_;
        pbVar9 = (byte *)(pGVar7->stack_).stackTop_;
        pbVar10 = (byte *)(pGVar7->stack_).stackEnd_;
        pbVar2 = pbVar9 + 1;
        if (cVar5 == '\0') {
          if (pbVar10 < pbVar2) goto LAB_0047f796;
          (pGVar7->stack_).stackTop_ = (char *)pbVar2;
          *pbVar9 = bVar4;
        }
        else {
          if (pbVar10 < pbVar2) goto LAB_0047f796;
          (pGVar7->stack_).stackTop_ = (char *)pbVar2;
          *pbVar9 = 0x5c;
          pGVar7 = this->os_;
          pcVar8 = (pGVar7->stack_).stackTop_;
          pcVar1 = pcVar8 + 1;
          if ((pGVar7->stack_).stackEnd_ < pcVar1) goto LAB_0047f796;
          (pGVar7->stack_).stackTop_ = pcVar1;
          *pcVar8 = cVar5;
          if (cVar5 == 'u') {
            pGVar7 = this->os_;
            pcVar8 = (pGVar7->stack_).stackTop_;
            pcVar1 = pcVar8 + 1;
            if ((pGVar7->stack_).stackEnd_ < pcVar1) goto LAB_0047f796;
            (pGVar7->stack_).stackTop_ = pcVar1;
            *pcVar8 = '0';
            pGVar7 = this->os_;
            pcVar8 = (pGVar7->stack_).stackTop_;
            pcVar1 = pcVar8 + 1;
            if ((pGVar7->stack_).stackEnd_ < pcVar1) goto LAB_0047f796;
            (pGVar7->stack_).stackTop_ = pcVar1;
            *pcVar8 = '0';
            pGVar7 = this->os_;
            pCVar11 = (pGVar7->stack_).stackTop_;
            pCVar3 = pCVar11 + 1;
            if ((pGVar7->stack_).stackEnd_ < pCVar3) goto LAB_0047f796;
            CVar6 = "0123456789ABCDEF"[bVar4 >> 4];
            (pGVar7->stack_).stackTop_ = pCVar3;
            *pCVar11 = CVar6;
            pGVar7 = this->os_;
            pCVar11 = (pGVar7->stack_).stackTop_;
            pCVar3 = pCVar11 + 1;
            if ((pGVar7->stack_).stackEnd_ < pCVar3) goto LAB_0047f796;
            CVar6 = "0123456789ABCDEF"[bVar4 & 0xf];
            (pGVar7->stack_).stackTop_ = pCVar3;
            *pCVar11 = CVar6;
          }
        }
        uVar12 = uVar12 + 1;
        bVar13 = uVar12 >= length;
      } while (uVar12 < length);
    }
    pGVar7 = this->os_;
    pcVar8 = (pGVar7->stack_).stackTop_;
    pcVar1 = pcVar8 + 1;
    if (pcVar1 <= (pGVar7->stack_).stackEnd_) {
      (pGVar7->stack_).stackTop_ = pcVar1;
      *pcVar8 = '\"';
      return bVar13;
    }
  }
LAB_0047f796:
  __assert_fail("stackTop_ + sizeof(T) * count <= stackEnd_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/internal/stack.h"
                ,0x81,
                "T *rapidjson::internal::Stack<rapidjson::CrtAllocator>::PushUnsafe(size_t) [Allocator = rapidjson::CrtAllocator, T = char]"
               );
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const typename TargetEncoding::Ch hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        if (TargetEncoding::supportUnicode)
            PutReserve(*os_, 2 + length * 6); // "\uxxxx..."
        else
            PutReserve(*os_, 2 + length * 12);  // "\uxxxx\uyyyy..."

        PutUnsafe(*os_, '\"');
        GenericStringStream<SourceEncoding> is(str);
        while (ScanWriteUnescapedString(is, length)) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && static_cast<unsigned>(c) >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (RAPIDJSON_UNLIKELY(!SourceEncoding::Decode(is, &codepoint)))
                    return false;
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, 'u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    PutUnsafe(*os_, hexDigits[(codepoint >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    PutUnsafe(*os_, hexDigits[(lead >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(lead      ) & 15]);
                    PutUnsafe(*os_, '\\');
                    PutUnsafe(*os_, 'u');
                    PutUnsafe(*os_, hexDigits[(trail >> 12) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  8) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail >>  4) & 15]);
                    PutUnsafe(*os_, hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || static_cast<unsigned>(c) < 256) && RAPIDJSON_UNLIKELY(escape[static_cast<unsigned char>(c)]))  {
                is.Take();
                PutUnsafe(*os_, '\\');
                PutUnsafe(*os_, static_cast<typename TargetEncoding::Ch>(escape[static_cast<unsigned char>(c)]));
                if (escape[static_cast<unsigned char>(c)] == 'u') {
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, '0');
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) >> 4]);
                    PutUnsafe(*os_, hexDigits[static_cast<unsigned char>(c) & 0xF]);
                }
            }
            else if (RAPIDJSON_UNLIKELY(!(writeFlags & kWriteValidateEncodingFlag ? 
                Transcoder<SourceEncoding, TargetEncoding>::Validate(is, *os_) :
                Transcoder<SourceEncoding, TargetEncoding>::TranscodeUnsafe(is, *os_))))
                return false;
        }
        PutUnsafe(*os_, '\"');
        return true;
    }